

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

void __thiscall google::protobuf::io::CodedOutputStream::~CodedOutputStream(CodedOutputStream *this)

{
  if (0 < this->buffer_size_) {
    (*this->output_->_vptr_ZeroCopyOutputStream[3])();
    this->total_bytes_ = this->total_bytes_ - this->buffer_size_;
    this->buffer_size_ = 0;
    this->buffer_ = (uint8 *)0x0;
  }
  return;
}

Assistant:

void CodedOutputStream::Trim() {
  if (buffer_size_ > 0) {
    output_->BackUp(buffer_size_);
    total_bytes_ -= buffer_size_;
    buffer_size_ = 0;
    buffer_ = NULL;
  }
}